

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::SELU_x86_avx::forward_inplace(SELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [24];
  long *in_RSI;
  long in_RDI;
  float fVar33;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar34 [32];
  float fVar41;
  float alphaxlambda;
  __m128 _blob_1;
  __m128 _neg_1;
  __m128 _pos_1;
  __m128 _p_1;
  __m128 _lambda128;
  __m128 _alpha128;
  __m128 _one128;
  __m128 _zero128;
  __m256 _blob;
  __m256 _neg;
  __m256 _pos;
  __m256 _p;
  __m256 _lambda256;
  __m256 _alpha256;
  __m256 _one256;
  __m256 _zero256;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int elempack;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 local_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined1 local_1700 [8];
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  int local_15f0;
  undefined8 local_15e0;
  undefined8 local_15d8;
  undefined8 local_15d0;
  undefined4 local_15c8;
  long local_15c0;
  undefined4 local_15b8;
  undefined4 local_15b4;
  undefined4 local_15b0;
  undefined4 local_15ac;
  undefined4 local_15a8;
  undefined8 local_15a0;
  undefined1 (*local_1598) [32];
  int local_158c;
  int local_1588;
  int local_1584;
  int local_1580;
  int local_157c;
  int local_1578;
  int local_1574;
  long *local_1568;
  undefined1 local_1555;
  int local_1554;
  undefined8 *local_1548;
  undefined8 *local_1540;
  undefined8 *local_1530;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  uint local_14f4;
  uint local_14f0;
  undefined4 local_14ec;
  undefined1 (*local_14e8) [32];
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [32];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [8];
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined1 (*local_1098) [32];
  undefined8 local_1090;
  undefined8 uStack_1088;
  float local_1080;
  float fStack_107c;
  float fStack_1078;
  float fStack_1074;
  float local_1064;
  float local_1060;
  float fStack_105c;
  float fStack_1058;
  float fStack_1054;
  float local_1044;
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 local_102c;
  undefined1 (*local_1028) [32];
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 local_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_fd0;
  undefined8 uStack_fc8;
  undefined1 local_fc0 [16];
  undefined8 local_fb0;
  undefined8 uStack_fa8;
  undefined1 local_fa0 [16];
  undefined1 local_f90 [8];
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined1 local_f70 [16];
  undefined1 local_f60 [16];
  undefined8 local_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 local_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 local_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  float local_e70;
  float fStack_e6c;
  float fStack_e68;
  float fStack_e64;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 local_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 local_dd0;
  undefined8 uStack_dc8;
  undefined1 (*local_db8) [32];
  long local_db0;
  undefined4 local_da4;
  long local_da0;
  undefined1 (*local_d98) [32];
  undefined4 local_d8c;
  int local_d88;
  int local_d84;
  undefined8 *local_d80;
  undefined4 local_d74;
  long local_d70;
  undefined8 *local_d50;
  undefined1 local_d20 [16];
  undefined1 auStack_d10 [16];
  undefined4 local_d00;
  undefined4 local_cfc;
  undefined4 local_cf8;
  undefined4 local_cf4;
  undefined4 local_cf0;
  undefined4 local_cec;
  undefined4 local_ce8;
  undefined4 local_ce4;
  undefined1 local_ce0 [16];
  undefined1 auStack_cd0 [16];
  uint local_cc0;
  uint local_cbc;
  uint local_cb8;
  uint local_cb4;
  uint local_cb0;
  uint local_cac;
  uint local_ca8;
  uint local_ca4;
  undefined1 local_ca0 [32];
  uint local_c78;
  uint local_c74;
  uint local_c70;
  uint local_c6c;
  uint local_c68;
  uint local_c64;
  uint local_c60;
  uint local_c5c;
  undefined1 *local_c58;
  undefined8 *local_c50;
  undefined8 *local_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  float *local_bb8;
  undefined1 *local_bb0;
  undefined8 *local_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  float local_b60 [2];
  float afStack_b58 [2];
  float afStack_b50 [2];
  float afStack_b48 [2];
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  float *local_b18;
  undefined1 *local_b10;
  undefined8 *local_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  float local_ac0 [2];
  float afStack_ab8 [2];
  float afStack_ab0 [2];
  float afStack_aa8 [2];
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float *local_a78;
  undefined1 *local_a70;
  undefined8 *local_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20 [2];
  float afStack_a18 [2];
  float afStack_a10 [2];
  float afStack_a08 [2];
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float *local_9d8;
  undefined1 *local_9d0;
  undefined8 *local_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  float local_980 [2];
  float afStack_978 [2];
  float afStack_970 [2];
  float afStack_968 [2];
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  float *local_938;
  undefined1 *local_930;
  undefined8 *local_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float local_8e0 [2];
  float afStack_8d8 [2];
  float afStack_8d0 [2];
  float afStack_8c8 [2];
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float *local_898;
  float *local_890;
  undefined1 *local_888;
  float local_880 [2];
  float afStack_878 [2];
  float afStack_870 [2];
  float afStack_868 [2];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  float local_840 [2];
  float afStack_838 [2];
  float afStack_830 [2];
  float afStack_828 [2];
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined4 uStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 *local_7b8;
  float *local_7b0;
  undefined1 *local_7a8;
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760 [2];
  float afStack_758 [2];
  float afStack_750 [2];
  float afStack_748 [2];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 *local_718;
  float *local_710;
  undefined1 *local_708;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6c0 [2];
  float afStack_6b8 [2];
  float afStack_6b0 [2];
  float afStack_6a8 [2];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined4 local_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined4 local_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined4 local_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined4 local_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined1 *local_338;
  float *local_330;
  undefined1 *local_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300 [2];
  float afStack_2f8 [2];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 *local_2d8;
  float *local_2d0;
  undefined1 *local_2c8;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0 [2];
  float afStack_298 [2];
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float *local_218;
  undefined1 *local_210;
  undefined8 *local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1e0 [2];
  float afStack_1d8 [2];
  float local_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float *local_1b8;
  undefined1 *local_1b0;
  undefined8 *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  float local_180 [2];
  float afStack_178 [2];
  float local_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float *local_158;
  undefined1 *local_150;
  undefined8 *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120 [2];
  float afStack_118 [2];
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float *local_f8;
  undefined1 *local_f0;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  float local_c0 [2];
  float afStack_b8 [2];
  float local_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float *local_98;
  undefined1 *local_90;
  undefined8 *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  float local_60 [2];
  float afStack_58 [2];
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1574 = *(int *)((long)in_RSI + 0x2c);
  local_1578 = (int)in_RSI[6];
  local_157c = *(int *)((long)in_RSI + 0x34);
  local_1580 = (int)in_RSI[3];
  local_1584 = (int)in_RSI[7];
  local_1588 = local_1574 * local_1578 * local_157c * local_1580;
  local_1568 = in_RSI;
  for (local_158c = 0; local_158c < local_1584; local_158c = local_158c + 1) {
    local_1548 = &local_15e0;
    local_d84 = *(int *)((long)local_1568 + 0x2c);
    local_d88 = (int)local_1568[6];
    local_d8c = *(undefined4 *)((long)local_1568 + 0x34);
    local_d98 = (undefined1 (*) [32])
                (*local_1568 + local_1568[8] * (long)local_158c * local_1568[2]);
    local_da0 = local_1568[2];
    local_da4 = (undefined4)local_1568[3];
    local_db0 = local_1568[4];
    local_d80 = &local_15e0;
    local_d70 = (long)local_d84 * (long)local_d88 * local_da0;
    local_1540 = &local_15e0;
    local_1530 = &local_15e0;
    local_d74 = 0x10;
    local_1554 = local_158c;
    local_1555 = 1;
    local_15e0 = 0;
    local_15d0 = 0;
    local_15c8 = 0;
    local_15b8 = 0;
    local_15b4 = 0;
    local_15b0 = 0;
    local_15ac = 0;
    local_15a8 = 0;
    local_15a0 = 0;
    local_15d8 = 0;
    local_15f0 = 0;
    local_1520 = 0;
    uStack_1518 = 0;
    uStack_1510 = 0;
    uStack_1508 = 0;
    local_14ec = 0x3f800000;
    local_ce4 = 0x3f800000;
    local_ce8 = 0x3f800000;
    local_cec = 0x3f800000;
    local_cf0 = 0x3f800000;
    local_cf4 = 0x3f800000;
    local_cf8 = 0x3f800000;
    local_cfc = 0x3f800000;
    local_d00 = 0x3f800000;
    auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
    local_d20 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
    auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
    auStack_d10 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
    local_14f0 = *(uint *)(in_RDI + 0xd0);
    auVar1 = vinsertps_avx(ZEXT416(local_14f0),ZEXT416(local_14f0),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_14f0),0x20);
    local_ce0 = vinsertps_avx(auVar1,ZEXT416(local_14f0),0x30);
    auVar1 = vinsertps_avx(ZEXT416(local_14f0),ZEXT416(local_14f0),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_14f0),0x20);
    auStack_cd0 = vinsertps_avx(auVar1,ZEXT416(local_14f0),0x30);
    local_14f4 = *(uint *)(in_RDI + 0xd4);
    auVar1 = vinsertps_avx(ZEXT416(local_14f4),ZEXT416(local_14f4),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_14f4),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_14f4),0x30);
    auVar2 = vinsertps_avx(ZEXT416(local_14f4),ZEXT416(local_14f4),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_14f4),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_14f4),0x30);
    auVar34._16_16_ = auVar1;
    auVar34._0_16_ = auVar2;
    local_ca0._0_8_ = auVar2._0_8_;
    local_ca0._8_8_ = auVar2._8_8_;
    local_ca0._16_8_ = auVar1._0_8_;
    local_ca0._24_8_ = auVar1._8_8_;
    local_1598 = local_d98;
    for (; local_15f0 + 7 < local_1588; local_15f0 = local_15f0 + 8) {
      local_14e8 = local_1598;
      local_14e0 = *(undefined8 *)*local_1598;
      uStack_14d8 = *(undefined8 *)(*local_1598 + 8);
      uStack_14d0 = *(undefined8 *)(*local_1598 + 0x10);
      uStack_14c8 = *(undefined8 *)(*local_1598 + 0x18);
      local_14c0 = 0;
      uStack_14b8 = 0;
      uStack_14b0 = 0;
      uStack_14a8 = 0;
      auVar5 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*local_1598);
      local_1480 = 0;
      uStack_1478 = 0;
      uStack_1470 = 0;
      uStack_1468 = 0;
      auVar7 = vminps_avx(ZEXT1632(ZEXT816(0)),*local_1598);
      local_16e0 = auVar7._0_8_;
      uStack_16d8 = auVar7._8_8_;
      uStack_16d0 = auVar7._16_8_;
      uStack_16c8 = auVar7._24_8_;
      local_1360 = ZEXT832(0) << 0x20;
      local_1400 = 0x3f8000003f800000;
      uStack_13f8 = 0x3f8000003f800000;
      uStack_13f0 = 0x3f8000003f800000;
      uStack_13e8 = 0x3f8000003f800000;
      local_12e0 = local_16e0;
      uStack_12d8 = uStack_16d8;
      uStack_12d0 = uStack_16d0;
      uStack_12c8 = uStack_16c8;
      local_1300 = 0x42b0c0a542b0c0a5;
      uStack_12f8 = 0x42b0c0a542b0c0a5;
      uStack_12f0 = 0x42b0c0a542b0c0a5;
      uStack_12e8 = 0x42b0c0a542b0c0a5;
      auVar8._8_8_ = 0x42b0c0a542b0c0a5;
      auVar8._0_8_ = 0x42b0c0a542b0c0a5;
      auVar8._16_8_ = 0x42b0c0a542b0c0a5;
      auVar8._24_8_ = 0x42b0c0a542b0c0a5;
      auVar7 = vminps_avx(auVar7,auVar8);
      local_1380._0_8_ = auVar7._0_8_;
      local_1320 = local_1380._0_8_;
      local_1380._8_8_ = auVar7._8_8_;
      uStack_1318 = local_1380._8_8_;
      local_1380._16_8_ = auVar7._16_8_;
      uStack_1310 = local_1380._16_8_;
      local_1380._24_8_ = auVar7._24_8_;
      uStack_1308 = local_1380._24_8_;
      local_1340 = 0xc2b0c0a5c2b0c0a5;
      uStack_1338 = 0xc2b0c0a5c2b0c0a5;
      uStack_1330 = 0xc2b0c0a5c2b0c0a5;
      uStack_1328 = 0xc2b0c0a5c2b0c0a5;
      auVar6._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6 = vmaxps_avx(auVar7,auVar6);
      local_c58 = local_1380;
      local_890 = ::_ps256_cephes_LOG2EF;
      local_898 = ::_ps256_0p5;
      local_1380._0_8_ = auVar6._0_8_;
      uVar9 = local_1380._0_8_;
      local_1380._8_8_ = auVar6._8_8_;
      uVar10 = local_1380._8_8_;
      local_1380._16_8_ = auVar6._16_8_;
      uVar11 = local_1380._16_8_;
      local_1380._24_8_ = auVar6._24_8_;
      uVar12 = local_1380._24_8_;
      local_880[0] = 1.442695;
      local_880[1] = 1.442695;
      afStack_878[0] = 1.442695;
      afStack_878[1] = 1.442695;
      afStack_870[0] = 1.442695;
      afStack_870[1] = 1.442695;
      afStack_868[0] = 1.442695;
      afStack_868[1] = 1.442695;
      local_860._0_4_ = auVar6._0_4_;
      local_860._4_4_ = auVar6._4_4_;
      uStack_858._0_4_ = auVar6._8_4_;
      uStack_858._4_4_ = auVar6._12_4_;
      uStack_850._0_4_ = auVar6._16_4_;
      uStack_850._4_4_ = auVar6._20_4_;
      uStack_848._0_4_ = auVar6._24_4_;
      uStack_804 = 0x3fb8aa3b;
      local_820 = (float)local_860 * 1.442695;
      fStack_81c = local_860._4_4_ * 1.442695;
      fStack_818 = (float)uStack_858 * 1.442695;
      fStack_814 = uStack_858._4_4_ * 1.442695;
      fStack_810 = (float)uStack_850 * 1.442695;
      fStack_80c = uStack_850._4_4_ * 1.442695;
      fStack_808 = (float)uStack_848 * 1.442695;
      local_840[0] = 0.5;
      local_840[1] = 0.5;
      afStack_838[0] = 0.5;
      afStack_838[1] = 0.5;
      afStack_830[0] = 0.5;
      afStack_830[1] = 0.5;
      afStack_828[0] = 0.5;
      afStack_828[1] = 0.5;
      local_13c0._4_4_ = fStack_81c + 0.5;
      local_13c0._0_4_ = local_820 + 0.5;
      uStack_13b8._0_4_ = fStack_818 + 0.5;
      uStack_13b8._4_4_ = fStack_814 + 0.5;
      uStack_13b0._0_4_ = fStack_810 + 0.5;
      uStack_13b0._4_4_ = fStack_80c + 0.5;
      uStack_13a8._0_4_ = fStack_808 + 0.5;
      uStack_13a8._4_4_ = 0x3ff8aa3b;
      auVar8 = vroundps_avx(_local_13c0,1);
      auVar7 = vcmpps_avx(_local_13c0,auVar8,1);
      local_1420._0_8_ = auVar7._0_8_;
      local_7e0 = local_1420._0_8_;
      local_1420._8_8_ = auVar7._8_8_;
      uStack_7d8 = local_1420._8_8_;
      local_1420._16_8_ = auVar7._16_8_;
      uStack_7d0 = local_1420._16_8_;
      local_1420._24_8_ = auVar7._24_8_;
      uStack_7c8 = local_1420._24_8_;
      local_800 = 0x3f8000003f800000;
      uStack_7f8 = 0x3f8000003f800000;
      uStack_7f0 = 0x3f8000003f800000;
      uStack_7e8 = 0x3f8000003f800000;
      auVar20._8_8_ = 0x3f8000003f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._16_8_ = 0x3f8000003f800000;
      auVar20._24_8_ = 0x3f8000003f800000;
      local_1420 = vandps_avx(auVar7,auVar20);
      local_13a0 = auVar8._0_8_;
      local_12a0 = local_13a0;
      uStack_1398 = auVar8._8_8_;
      uStack_1298 = uStack_1398;
      uStack_1390 = auVar8._16_8_;
      uStack_1290 = uStack_1390;
      uStack_1388 = auVar8._24_8_;
      uStack_1288 = uStack_1388;
      local_12c0 = local_1420._0_8_;
      uStack_12b8 = local_1420._8_8_;
      uStack_12b0 = local_1420._16_8_;
      uStack_12a8 = local_1420._24_8_;
      _local_13c0 = vsubps_avx(auVar8,local_1420);
      local_7a8 = local_13c0;
      local_710 = ::_ps256_cephes_exp_C1;
      local_6e0 = local_1380._0_8_;
      uStack_6d8 = local_1380._8_8_;
      uStack_6d0 = local_1380._16_8_;
      uStack_6c8 = local_1380._24_8_;
      local_6c0[0] = 0.6933594;
      local_6c0[1] = 0.6933594;
      afStack_6b8[0] = 0.6933594;
      afStack_6b8[1] = 0.6933594;
      afStack_6b0[0] = 0.6933594;
      afStack_6b0[1] = 0.6933594;
      afStack_6a8[0] = 0.6933594;
      afStack_6a8[1] = 0.6933594;
      local_6a0._0_4_ = local_13c0._0_4_;
      local_6a0._4_4_ = local_13c0._4_4_;
      uStack_698._0_4_ = local_13c0._8_4_;
      uStack_698._4_4_ = local_13c0._12_4_;
      uStack_690._0_4_ = local_13c0._16_4_;
      uStack_690._4_4_ = local_13c0._20_4_;
      uStack_688._0_4_ = local_13c0._24_4_;
      uStack_688._4_4_ = local_13c0._28_4_;
      fStack_6e4 = uStack_688._4_4_;
      local_700 = (float)local_6a0 * 0.6933594;
      fStack_6fc = local_6a0._4_4_ * 0.6933594;
      fStack_6f8 = (float)uStack_698 * 0.6933594;
      fStack_6f4 = uStack_698._4_4_ * 0.6933594;
      fStack_6f0 = (float)uStack_690 * 0.6933594;
      fStack_6ec = uStack_690._4_4_ * 0.6933594;
      fStack_6e8 = (float)uStack_688 * 0.6933594;
      auVar22._4_4_ = fStack_6fc;
      auVar22._0_4_ = local_700;
      auVar22._8_4_ = fStack_6f8;
      auVar22._12_4_ = fStack_6f4;
      auVar22._16_4_ = fStack_6f0;
      auVar22._20_4_ = fStack_6ec;
      auVar22._24_4_ = fStack_6e8;
      auVar22._28_4_ = uStack_688._4_4_;
      auVar7 = vsubps_avx(auVar6,auVar22);
      local_7b0 = ::_ps256_cephes_exp_C2;
      local_1380._0_8_ = auVar7._0_8_;
      local_780 = local_1380._0_8_;
      local_1380._8_8_ = auVar7._8_8_;
      uStack_778 = local_1380._8_8_;
      local_1380._16_8_ = auVar7._16_8_;
      uStack_770 = local_1380._16_8_;
      local_1380._24_8_ = auVar7._24_8_;
      uStack_768 = local_1380._24_8_;
      local_740 = local_13c0;
      uStack_738 = uStack_13b8;
      uStack_730 = uStack_13b0;
      uStack_728 = uStack_13a8;
      local_760[0] = -0.00021219444;
      local_760[1] = -0.00021219444;
      afStack_758[0] = -0.00021219444;
      afStack_758[1] = -0.00021219444;
      afStack_750[0] = -0.00021219444;
      afStack_750[1] = -0.00021219444;
      afStack_748[0] = -0.00021219444;
      afStack_748[1] = -0.00021219444;
      fStack_784 = uStack_688._4_4_;
      local_7a0 = (float)local_6a0 * -0.00021219444;
      fStack_79c = local_6a0._4_4_ * -0.00021219444;
      fStack_798 = (float)uStack_698 * -0.00021219444;
      fStack_794 = uStack_698._4_4_ * -0.00021219444;
      fStack_790 = (float)uStack_690 * -0.00021219444;
      fStack_78c = uStack_690._4_4_ * -0.00021219444;
      fStack_788 = (float)uStack_688 * -0.00021219444;
      auVar21._4_4_ = fStack_79c;
      auVar21._0_4_ = local_7a0;
      auVar21._8_4_ = fStack_798;
      auVar21._12_4_ = fStack_794;
      auVar21._16_4_ = fStack_790;
      auVar21._20_4_ = fStack_78c;
      auVar21._24_4_ = fStack_788;
      auVar21._28_4_ = uStack_688._4_4_;
      local_1380 = vsubps_avx(auVar7,auVar21);
      local_1200 = local_1380._0_8_;
      uStack_11f8 = local_1380._8_8_;
      uStack_11f0 = local_1380._16_8_;
      uStack_11e8 = local_1380._24_8_;
      local_11e0._0_4_ = local_1380._0_4_;
      local_11e0._4_4_ = local_1380._4_4_;
      uStack_11d8._0_4_ = local_1380._8_4_;
      uStack_11d8._4_4_ = local_1380._12_4_;
      uStack_11d0._0_4_ = local_1380._16_4_;
      uStack_11d0._4_4_ = local_1380._20_4_;
      uStack_11c8._0_4_ = local_1380._24_4_;
      uStack_11c8._4_4_ = local_1380._28_4_;
      local_13a0 = CONCAT44(local_11e0._4_4_ * local_11e0._4_4_,
                            (float)local_11e0 * (float)local_11e0);
      uStack_1398._0_4_ = (float)uStack_11d8 * (float)uStack_11d8;
      uStack_1398._4_4_ = uStack_11d8._4_4_ * uStack_11d8._4_4_;
      uStack_1390._0_4_ = (float)uStack_11d0 * (float)uStack_11d0;
      uStack_1390._4_4_ = uStack_11d0._4_4_ * uStack_11d0._4_4_;
      auVar32 = _local_13a0;
      uStack_1388._0_4_ = (float)uStack_11c8 * (float)uStack_11c8;
      uStack_1388._4_4_ = uStack_11c8._4_4_;
      auVar6 = _local_13a0;
      local_c48 = &local_1440;
      local_938 = ::_ps256_cephes_exp_p1;
      local_900 = 0x3950696739506967;
      uStack_8f8 = 0x3950696739506967;
      uStack_8f0 = 0x3950696739506967;
      uStack_8e8 = 0x3950696739506967;
      local_920 = local_1380._0_8_;
      uStack_918 = local_1380._8_8_;
      uStack_910 = local_1380._16_8_;
      uStack_908 = local_1380._24_8_;
      fStack_8a4 = uStack_11c8._4_4_;
      local_8c0 = (float)local_11e0 * 0.00019875691;
      fStack_8bc = local_11e0._4_4_ * 0.00019875691;
      fStack_8b8 = (float)uStack_11d8 * 0.00019875691;
      fStack_8b4 = uStack_11d8._4_4_ * 0.00019875691;
      fStack_8b0 = (float)uStack_11d0 * 0.00019875691;
      fStack_8ac = uStack_11d0._4_4_ * 0.00019875691;
      fStack_8a8 = (float)uStack_11c8 * 0.00019875691;
      local_8e0[0] = 0.0013981999;
      local_8e0[1] = 0.0013981999;
      afStack_8d8[0] = 0.0013981999;
      afStack_8d8[1] = 0.0013981999;
      afStack_8d0[0] = 0.0013981999;
      afStack_8d0[1] = 0.0013981999;
      afStack_8c8[0] = 0.0013981999;
      afStack_8c8[1] = 0.0013981999;
      local_1440 = CONCAT44(fStack_8bc + 0.0013981999,local_8c0 + 0.0013981999);
      uStack_1438 = CONCAT44(fStack_8b4 + 0.0013981999,fStack_8b8 + 0.0013981999);
      uStack_1430 = CONCAT44(fStack_8ac + 0.0013981999,fStack_8b0 + 0.0013981999);
      uStack_1428 = CONCAT44(uStack_11c8._4_4_ + 0.0013981999,fStack_8a8 + 0.0013981999);
      local_9d8 = ::_ps256_cephes_exp_p2;
      local_9a0 = local_1440;
      uStack_998 = uStack_1438;
      uStack_990 = uStack_1430;
      uStack_988 = uStack_1428;
      local_9c0 = local_1380._0_8_;
      uStack_9b8 = local_1380._8_8_;
      uStack_9b0 = local_1380._16_8_;
      uStack_9a8 = local_1380._24_8_;
      fStack_944 = uStack_11c8._4_4_;
      local_960 = (local_8c0 + 0.0013981999) * (float)local_11e0;
      fStack_95c = (fStack_8bc + 0.0013981999) * local_11e0._4_4_;
      fStack_958 = (fStack_8b8 + 0.0013981999) * (float)uStack_11d8;
      fStack_954 = (fStack_8b4 + 0.0013981999) * uStack_11d8._4_4_;
      fStack_950 = (fStack_8b0 + 0.0013981999) * (float)uStack_11d0;
      fStack_94c = (fStack_8ac + 0.0013981999) * uStack_11d0._4_4_;
      fStack_948 = (fStack_8a8 + 0.0013981999) * (float)uStack_11c8;
      local_980[0] = 0.008333452;
      local_980[1] = 0.008333452;
      afStack_978[0] = 0.008333452;
      afStack_978[1] = 0.008333452;
      afStack_970[0] = 0.008333452;
      afStack_970[1] = 0.008333452;
      afStack_968[0] = 0.008333452;
      afStack_968[1] = 0.008333452;
      local_1440 = CONCAT44(fStack_95c + 0.008333452,local_960 + 0.008333452);
      uStack_1438 = CONCAT44(fStack_954 + 0.008333452,fStack_958 + 0.008333452);
      uStack_1430 = CONCAT44(fStack_94c + 0.008333452,fStack_950 + 0.008333452);
      uStack_1428 = CONCAT44(uStack_11c8._4_4_ + 0.008333452,fStack_948 + 0.008333452);
      local_a78 = ::_ps256_cephes_exp_p3;
      local_a40 = local_1440;
      uStack_a38 = uStack_1438;
      uStack_a30 = uStack_1430;
      uStack_a28 = uStack_1428;
      local_a60 = local_1380._0_8_;
      uStack_a58 = local_1380._8_8_;
      uStack_a50 = local_1380._16_8_;
      uStack_a48 = local_1380._24_8_;
      fStack_9e4 = uStack_11c8._4_4_;
      local_a00 = (local_960 + 0.008333452) * (float)local_11e0;
      fStack_9fc = (fStack_95c + 0.008333452) * local_11e0._4_4_;
      fStack_9f8 = (fStack_958 + 0.008333452) * (float)uStack_11d8;
      fStack_9f4 = (fStack_954 + 0.008333452) * uStack_11d8._4_4_;
      fStack_9f0 = (fStack_950 + 0.008333452) * (float)uStack_11d0;
      fStack_9ec = (fStack_94c + 0.008333452) * uStack_11d0._4_4_;
      fStack_9e8 = (fStack_948 + 0.008333452) * (float)uStack_11c8;
      local_a20[0] = 0.041665796;
      local_a20[1] = 0.041665796;
      afStack_a18[0] = 0.041665796;
      afStack_a18[1] = 0.041665796;
      afStack_a10[0] = 0.041665796;
      afStack_a10[1] = 0.041665796;
      afStack_a08[0] = 0.041665796;
      afStack_a08[1] = 0.041665796;
      local_1440 = CONCAT44(fStack_9fc + 0.041665796,local_a00 + 0.041665796);
      uStack_1438 = CONCAT44(fStack_9f4 + 0.041665796,fStack_9f8 + 0.041665796);
      uStack_1430 = CONCAT44(fStack_9ec + 0.041665796,fStack_9f0 + 0.041665796);
      uStack_1428 = CONCAT44(uStack_11c8._4_4_ + 0.041665796,fStack_9e8 + 0.041665796);
      local_b18 = ::_ps256_cephes_exp_p4;
      local_ae0 = local_1440;
      uStack_ad8 = uStack_1438;
      uStack_ad0 = uStack_1430;
      uStack_ac8 = uStack_1428;
      local_b00 = local_1380._0_8_;
      uStack_af8 = local_1380._8_8_;
      uStack_af0 = local_1380._16_8_;
      uStack_ae8 = local_1380._24_8_;
      fStack_a84 = uStack_11c8._4_4_;
      local_aa0 = (local_a00 + 0.041665796) * (float)local_11e0;
      fStack_a9c = (fStack_9fc + 0.041665796) * local_11e0._4_4_;
      fStack_a98 = (fStack_9f8 + 0.041665796) * (float)uStack_11d8;
      fStack_a94 = (fStack_9f4 + 0.041665796) * uStack_11d8._4_4_;
      fStack_a90 = (fStack_9f0 + 0.041665796) * (float)uStack_11d0;
      fStack_a8c = (fStack_9ec + 0.041665796) * uStack_11d0._4_4_;
      fStack_a88 = (fStack_9e8 + 0.041665796) * (float)uStack_11c8;
      local_ac0[0] = 0.16666666;
      local_ac0[1] = 0.16666666;
      afStack_ab8[0] = 0.16666666;
      afStack_ab8[1] = 0.16666666;
      afStack_ab0[0] = 0.16666666;
      afStack_ab0[1] = 0.16666666;
      afStack_aa8[0] = 0.16666666;
      afStack_aa8[1] = 0.16666666;
      local_1440 = CONCAT44(fStack_a9c + 0.16666666,local_aa0 + 0.16666666);
      uStack_1438 = CONCAT44(fStack_a94 + 0.16666666,fStack_a98 + 0.16666666);
      uStack_1430 = CONCAT44(fStack_a8c + 0.16666666,fStack_a90 + 0.16666666);
      uStack_1428 = CONCAT44(uStack_11c8._4_4_ + 0.16666666,fStack_a88 + 0.16666666);
      local_bb8 = ::_ps256_cephes_exp_p5;
      local_b80 = local_1440;
      uStack_b78 = uStack_1438;
      uStack_b70 = uStack_1430;
      uStack_b68 = uStack_1428;
      local_ba0 = local_1380._0_8_;
      uStack_b98 = local_1380._8_8_;
      uStack_b90 = local_1380._16_8_;
      uStack_b88 = local_1380._24_8_;
      fStack_b24 = uStack_11c8._4_4_;
      local_b40 = (local_aa0 + 0.16666666) * (float)local_11e0;
      fStack_b3c = (fStack_a9c + 0.16666666) * local_11e0._4_4_;
      fStack_b38 = (fStack_a98 + 0.16666666) * (float)uStack_11d8;
      fStack_b34 = (fStack_a94 + 0.16666666) * uStack_11d8._4_4_;
      fStack_b30 = (fStack_a90 + 0.16666666) * (float)uStack_11d0;
      fStack_b2c = (fStack_a8c + 0.16666666) * uStack_11d0._4_4_;
      fStack_b28 = (fStack_a88 + 0.16666666) * (float)uStack_11c8;
      local_b60[0] = 0.5;
      local_b60[1] = 0.5;
      afStack_b58[0] = 0.5;
      afStack_b58[1] = 0.5;
      afStack_b50[0] = 0.5;
      afStack_b50[1] = 0.5;
      afStack_b48[0] = 0.5;
      afStack_b48[1] = 0.5;
      local_1440 = CONCAT44(fStack_b3c + 0.5,local_b40 + 0.5);
      uStack_1438 = CONCAT44(fStack_b34 + 0.5,fStack_b38 + 0.5);
      uStack_1430 = CONCAT44(fStack_b2c + 0.5,fStack_b30 + 0.5);
      uStack_1428 = CONCAT44(uStack_11c8._4_4_ + 0.5,fStack_b28 + 0.5);
      local_c50 = &local_13a0;
      local_c20 = local_1440;
      uStack_c18 = uStack_1438;
      uStack_c10 = uStack_1430;
      uStack_c08 = uStack_1428;
      local_c40 = local_13a0;
      uStack_c38 = uStack_1398;
      uStack_1390 = auVar32._16_8_;
      uStack_c30 = uStack_1390;
      uStack_1388 = auVar6._24_8_;
      uStack_c28 = uStack_1388;
      fStack_bc4 = uStack_11c8._4_4_;
      local_be0 = (local_b40 + 0.5) * (float)local_11e0 * (float)local_11e0;
      fStack_bdc = (fStack_b3c + 0.5) * local_11e0._4_4_ * local_11e0._4_4_;
      fStack_bd8 = (fStack_b38 + 0.5) * (float)uStack_11d8 * (float)uStack_11d8;
      fStack_bd4 = (fStack_b34 + 0.5) * uStack_11d8._4_4_ * uStack_11d8._4_4_;
      fStack_bd0 = (fStack_b30 + 0.5) * (float)uStack_11d0 * (float)uStack_11d0;
      fStack_bcc = (fStack_b2c + 0.5) * uStack_11d0._4_4_ * uStack_11d0._4_4_;
      fStack_bc8 = (fStack_b28 + 0.5) * (float)uStack_11c8 * (float)uStack_11c8;
      local_c00 = local_1380._0_8_;
      uStack_bf8 = local_1380._8_8_;
      uStack_bf0 = local_1380._16_8_;
      uStack_be8 = local_1380._24_8_;
      local_1440 = CONCAT44(fStack_bdc + local_11e0._4_4_,local_be0 + (float)local_11e0);
      uStack_1438 = CONCAT44(fStack_bd4 + uStack_11d8._4_4_,fStack_bd8 + (float)uStack_11d8);
      uStack_1430 = CONCAT44(fStack_bcc + uStack_11d0._4_4_,fStack_bd0 + (float)uStack_11d0);
      uStack_1428 = CONCAT44(uStack_11c8._4_4_ + uStack_11c8._4_4_,fStack_bc8 + (float)uStack_11c8);
      local_1120 = local_1440;
      uStack_1118 = uStack_1438;
      uStack_1110 = uStack_1430;
      uStack_1108 = uStack_1428;
      local_1140 = 0x3f8000003f800000;
      uStack_1138 = 0x3f8000003f800000;
      uStack_1130 = 0x3f8000003f800000;
      uStack_1128 = 0x3f8000003f800000;
      fVar33 = local_be0 + (float)local_11e0 + 1.0;
      fVar35 = fStack_bdc + local_11e0._4_4_ + 1.0;
      fVar36 = fStack_bd8 + (float)uStack_11d8 + 1.0;
      fVar37 = fStack_bd4 + uStack_11d8._4_4_ + 1.0;
      fVar38 = fStack_bd0 + (float)uStack_11d0 + 1.0;
      fVar39 = fStack_bcc + uStack_11d0._4_4_ + 1.0;
      fVar40 = fStack_bc8 + (float)uStack_11c8 + 1.0;
      fVar41 = uStack_11c8._4_4_ + uStack_11c8._4_4_ + 1.0;
      local_1440 = CONCAT44(fVar35,fVar33);
      uStack_1438 = CONCAT44(fVar37,fVar36);
      uStack_1430 = CONCAT44(fVar39,fVar38);
      uStack_1428 = CONCAT44(fVar41,fVar40);
      local_680 = local_13c0;
      uStack_678 = uStack_13b8;
      uStack_670 = uStack_13b0;
      uStack_668 = uStack_13a8;
      local_13e0 = CONCAT44((int)local_6a0._4_4_,(int)(float)local_6a0);
      uStack_13d8 = CONCAT44((int)uStack_698._4_4_,(int)(float)uStack_698);
      uStack_13d0 = CONCAT44((int)uStack_690._4_4_,(int)(float)uStack_690);
      uStack_13c8 = CONCAT44((int)uStack_688._4_4_,(int)(float)uStack_688);
      local_580 = local_13e0;
      uStack_578 = uStack_13d8;
      uStack_570 = uStack_13d0;
      uStack_568 = uStack_13c8;
      local_5a0 = 0x7f0000007f;
      uStack_598 = 0x7f0000007f;
      uStack_590 = 0x7f0000007f;
      uStack_588 = 0x7f0000007f;
      local_620 = local_13e0;
      uStack_618 = uStack_13d8;
      uStack_610 = uStack_13d0;
      uStack_608 = uStack_13c8;
      local_640 = 0x7f0000007f;
      uStack_638 = 0x7f0000007f;
      uStack_630 = 0x7f0000007f;
      uStack_628 = 0x7f0000007f;
      local_5d0 = 0x7f0000007f;
      uStack_5c8 = 0x7f0000007f;
      local_5e0 = 0x7f0000007f;
      uStack_5d8 = 0x7f0000007f;
      local_440 = local_13e0;
      uStack_438 = uStack_13d8;
      local_450 = 0x7f0000007f;
      uStack_448 = 0x7f0000007f;
      auVar24._8_8_ = uStack_13d8;
      auVar24._0_8_ = local_13e0;
      auVar23._8_8_ = 0x7f0000007f;
      auVar23._0_8_ = 0x7f0000007f;
      local_5b0 = vpaddd_avx(auVar24,auVar23);
      local_460 = uStack_13d0;
      uStack_458 = uStack_13c8;
      local_470 = 0x7f0000007f;
      uStack_468 = 0x7f0000007f;
      auVar4._8_8_ = uStack_13c8;
      auVar4._0_8_ = uStack_13d0;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_5c0 = vpaddd_avx(auVar4,auVar3);
      local_660 = local_5b0._0_8_;
      uStack_658 = local_5b0._8_8_;
      uStack_650 = local_5c0._0_8_;
      uStack_648 = local_5c0._8_8_;
      local_600 = local_5b0._0_8_;
      uStack_5f8 = local_5b0._8_8_;
      uStack_5f0 = local_5c0._0_8_;
      uStack_5e8 = local_5c0._8_8_;
      local_4c0 = local_5b0._0_8_;
      uStack_4b8 = local_5b0._8_8_;
      uStack_4b0 = local_5c0._0_8_;
      uStack_4a8 = local_5c0._8_8_;
      local_4c4 = 0x17;
      local_540 = local_5b0._0_8_;
      uStack_538 = local_5b0._8_8_;
      uStack_530 = local_5c0._0_8_;
      uStack_528 = local_5c0._8_8_;
      local_3e0 = local_5b0._0_8_;
      uStack_3d8 = local_5b0._8_8_;
      local_3e4 = 0x17;
      local_4e0 = vpslld_avx(local_5b0,ZEXT416(0x17));
      local_400 = local_5c0._0_8_;
      uStack_3f8 = local_5c0._8_8_;
      local_404 = 0x17;
      local_4f0 = vpslld_avx(local_5c0,ZEXT416(0x17));
      local_560 = local_4e0._0_8_;
      uStack_558 = local_4e0._8_8_;
      uStack_550 = local_4f0._0_8_;
      uStack_548 = local_4f0._8_8_;
      local_520 = local_4e0._0_8_;
      uStack_518 = local_4e0._8_8_;
      uStack_510 = local_4f0._0_8_;
      uStack_508 = local_4f0._8_8_;
      local_13e0 = local_4e0._0_8_;
      uStack_13d8 = local_4e0._8_8_;
      uStack_13d0 = local_4f0._0_8_;
      uStack_13c8 = local_4f0._8_8_;
      local_4a0 = local_4e0._0_8_;
      uStack_498 = local_4e0._8_8_;
      uStack_490 = local_4f0._0_8_;
      uStack_488 = local_4f0._8_8_;
      local_1460 = local_4e0._0_8_;
      uStack_1458 = local_4e0._8_8_;
      uStack_1450 = local_4f0._0_8_;
      uStack_1448 = local_4f0._8_8_;
      local_1220 = local_1440;
      uStack_1218 = uStack_1438;
      uStack_1210 = uStack_1430;
      uStack_1208 = uStack_1428;
      local_1240._0_4_ = local_4e0._0_4_;
      local_1240._4_4_ = local_4e0._4_4_;
      uStack_1238._0_4_ = local_4e0._8_4_;
      uStack_1238._4_4_ = local_4e0._12_4_;
      uStack_1230._0_4_ = local_4f0._0_4_;
      uStack_1230._4_4_ = local_4f0._4_4_;
      uStack_1228._0_4_ = local_4f0._8_4_;
      local_1440 = CONCAT44(fVar35 * local_1240._4_4_,fVar33 * (float)local_1240);
      uStack_1438 = CONCAT44(fVar37 * uStack_1238._4_4_,fVar36 * (float)uStack_1238);
      uStack_1430 = CONCAT44(fVar39 * uStack_1230._4_4_,fVar38 * (float)uStack_1230);
      uStack_1428 = CONCAT44(fVar41,fVar40 * (float)uStack_1228);
      uStack_16f8 = uStack_1438;
      local_1700 = (undefined1  [8])local_1440;
      local_1260 = local_1440;
      uStack_1258 = uStack_1438;
      uStack_1250 = uStack_1430;
      uStack_1248 = uStack_1428;
      local_1280 = local_d20._0_8_;
      uStack_1278 = local_d20._8_8_;
      uStack_1270 = auStack_d10._0_8_;
      uStack_1268 = auStack_d10._8_8_;
      auVar17._16_8_ = uStack_1430;
      auVar17._0_16_ = _local_1700;
      auVar17._24_8_ = uStack_1428;
      auVar7._16_8_ = auStack_d10._0_8_;
      auVar7._0_16_ = local_d20;
      auVar7._24_8_ = auStack_d10._8_8_;
      auVar7 = vsubps_avx(auVar17,auVar7);
      local_1700 = auVar7._0_8_;
      uVar13 = local_1700;
      uStack_16f8 = auVar7._8_8_;
      uVar14 = uStack_16f8;
      uStack_16f0 = auVar7._16_8_;
      uVar15 = uStack_16f0;
      uStack_16e8 = auVar7._24_8_;
      uVar16 = uStack_16e8;
      local_1160._0_4_ = local_ce0._0_4_;
      local_1160._4_4_ = local_ce0._4_4_;
      uStack_1158._0_4_ = local_ce0._8_4_;
      uStack_1158._4_4_ = local_ce0._12_4_;
      uStack_1150._0_4_ = auStack_cd0._0_4_;
      uStack_1150._4_4_ = auStack_cd0._4_4_;
      uStack_1148._0_4_ = auStack_cd0._8_4_;
      uStack_1148._4_4_ = auStack_cd0._12_4_;
      local_1180._0_4_ = auVar7._0_4_;
      local_1180._4_4_ = auVar7._4_4_;
      uStack_1178._0_4_ = auVar7._8_4_;
      uStack_1178._4_4_ = auVar7._12_4_;
      uStack_1170._0_4_ = auVar7._16_4_;
      uStack_1170._4_4_ = auVar7._20_4_;
      uStack_1168._0_4_ = auVar7._24_4_;
      local_1700._4_4_ = local_1160._4_4_ * local_1180._4_4_;
      local_1700._0_4_ = (float)local_1160 * (float)local_1180;
      uStack_16f8._0_4_ = (float)uStack_1158 * (float)uStack_1178;
      uStack_16f8._4_4_ = uStack_1158._4_4_ * uStack_1178._4_4_;
      uStack_16f0._0_4_ = (float)uStack_1150 * (float)uStack_1170;
      uStack_16f0._4_4_ = uStack_1150._4_4_ * uStack_1170._4_4_;
      auVar32 = _local_1700;
      uStack_16e8._0_4_ = (float)uStack_1148 * (float)uStack_1168;
      uStack_16e8._4_4_ = uStack_1148._4_4_;
      auVar7 = _local_1700;
      local_16c0 = auVar5._0_8_;
      uStack_16b8 = auVar5._8_8_;
      uStack_16b0 = auVar5._16_8_;
      uStack_16a8 = auVar5._24_8_;
      local_1100 = local_1700;
      uStack_10f8 = uStack_16f8;
      uStack_16f0 = auVar32._16_8_;
      uStack_10f0 = uStack_16f0;
      uStack_16e8 = auVar7._24_8_;
      uStack_10e8 = uStack_16e8;
      local_10e0._0_4_ = auVar5._0_4_;
      local_10e0._4_4_ = auVar5._4_4_;
      uStack_10d8._0_4_ = auVar5._8_4_;
      uStack_10d8._4_4_ = auVar5._12_4_;
      uStack_10d0._0_4_ = auVar5._16_4_;
      uStack_10d0._4_4_ = auVar5._20_4_;
      uStack_10c8._0_4_ = auVar5._24_4_;
      uStack_10c8._4_4_ = auVar5._28_4_;
      local_11c0 = (float)local_10e0 + (float)local_1160 * (float)local_1180;
      fStack_11bc = local_10e0._4_4_ + local_1160._4_4_ * local_1180._4_4_;
      fStack_11b8 = (float)uStack_10d8 + (float)uStack_1158 * (float)uStack_1178;
      fStack_11b4 = uStack_10d8._4_4_ + uStack_1158._4_4_ * uStack_1178._4_4_;
      fStack_11b0 = (float)uStack_10d0 + (float)uStack_1150 * (float)uStack_1170;
      fStack_11ac = uStack_10d0._4_4_ + uStack_1150._4_4_ * uStack_1170._4_4_;
      fStack_11a8 = (float)uStack_10c8 + (float)uStack_1148 * (float)uStack_1168;
      fStack_11a4 = uStack_10c8._4_4_ + uStack_1148._4_4_;
      local_11a0._0_4_ = auVar2._0_4_;
      local_11a0._4_4_ = auVar2._4_4_;
      uStack_1198._0_4_ = auVar2._8_4_;
      uStack_1198._4_4_ = auVar2._12_4_;
      uStack_1190._0_4_ = auVar1._0_4_;
      uStack_1190._4_4_ = auVar1._4_4_;
      uStack_1188._0_4_ = auVar1._8_4_;
      uStack_1188._4_4_ = auVar1._12_4_;
      local_1700._4_4_ = local_11a0._4_4_ * fStack_11bc;
      local_1700._0_4_ = (float)local_11a0 * local_11c0;
      uStack_16f8._0_4_ = (float)uStack_1198 * fStack_11b8;
      uStack_16f8._4_4_ = uStack_1198._4_4_ * fStack_11b4;
      uStack_16f0._0_4_ = (float)uStack_1190 * fStack_11b0;
      uStack_16f0._4_4_ = uStack_1190._4_4_ * fStack_11ac;
      auVar32 = _local_1700;
      uStack_16e8._0_4_ = (float)uStack_1188 * fStack_11a8;
      uStack_16e8._4_4_ = uStack_1188._4_4_;
      auVar7 = _local_1700;
      local_1098 = local_1598;
      local_10c0 = local_1700;
      uStack_10b8 = uStack_16f8;
      uStack_16f0 = auVar32._16_8_;
      uStack_10b0 = uStack_16f0;
      uStack_16e8 = auVar7._24_8_;
      uStack_10a8 = uStack_16e8;
      *(undefined1 (*) [8])*local_1598 = local_1700;
      *(undefined8 *)(*local_1598 + 8) = uStack_16f8;
      *(undefined8 *)(*local_1598 + 0x10) = uStack_16f0;
      *(undefined8 *)(*local_1598 + 0x18) = uStack_16e8;
      local_1598 = local_1598 + 1;
      local_14a0 = local_14e0;
      uStack_1498 = uStack_14d8;
      uStack_1490 = uStack_14d0;
      uStack_1488 = uStack_14c8;
      _local_13a0 = auVar6;
      local_1240 = local_4e0._0_8_;
      uStack_1238 = local_4e0._8_8_;
      uStack_1230 = local_4f0._0_8_;
      uStack_1228 = local_4f0._8_8_;
      local_11e0 = local_1200;
      uStack_11d8 = uStack_11f8;
      uStack_11d0 = uStack_11f0;
      uStack_11c8 = uStack_11e8;
      local_11a0 = local_ca0._0_8_;
      uStack_1198 = local_ca0._8_8_;
      uStack_1190 = local_ca0._16_8_;
      uStack_1188 = local_ca0._24_8_;
      local_1180 = uVar13;
      uStack_1178 = uVar14;
      uStack_1170 = uVar15;
      uStack_1168 = uVar16;
      local_1160 = local_ce0._0_8_;
      uStack_1158 = local_ce0._8_8_;
      uStack_1150 = auStack_cd0._0_8_;
      uStack_1148 = auStack_cd0._8_8_;
      local_10e0 = local_16c0;
      uStack_10d8 = uStack_16b8;
      uStack_10d0 = uStack_16b0;
      uStack_10c8 = uStack_16a8;
      local_bb0 = local_c58;
      local_ba8 = local_c48;
      local_b10 = local_c58;
      local_b08 = local_c48;
      local_a70 = local_c58;
      local_a68 = local_c48;
      local_9d0 = local_c58;
      local_9c8 = local_c48;
      local_930 = local_c58;
      local_928 = local_c48;
      local_888 = local_c58;
      local_860 = uVar9;
      uStack_858 = uVar10;
      uStack_850 = uVar11;
      uStack_848 = uVar12;
      local_7b8 = local_c58;
      local_718 = local_c58;
      local_708 = local_7a8;
      local_6a0 = local_13c0;
      uStack_698 = uStack_13b8;
      uStack_690 = uStack_13b0;
      uStack_688 = uStack_13a8;
    }
    local_1090 = 0;
    uStack_1088 = 0;
    local_102c = 0x3f800000;
    local_1040 = 0x3f800000;
    uStack_103c = 0x3f800000;
    uStack_1038 = 0x3f800000;
    uStack_1034 = 0x3f800000;
    local_1060 = *(float *)(in_RDI + 0xd0);
    local_1080 = *(float *)(in_RDI + 0xd4);
    for (; local_15f0 + 3 < local_1588; local_15f0 = local_15f0 + 4) {
      local_1028 = local_1598;
      local_1020 = *(undefined8 *)*local_1598;
      uStack_1018 = *(undefined8 *)(*local_1598 + 8);
      local_1010 = 0;
      uStack_1008 = 0;
      auVar3 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_1598);
      local_ff0 = 0;
      uStack_fe8 = 0;
      auVar1 = vminps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_1598);
      local_1770 = auVar1._0_8_;
      uStack_1768 = auVar1._8_8_;
      local_f60 = ZEXT816(0) << 0x20;
      local_fb0 = 0x3f8000003f800000;
      uStack_fa8 = 0x3f8000003f800000;
      local_f20 = local_1770;
      uStack_f18 = uStack_1768;
      local_f30 = 0x42b0c0a542b0c0a5;
      uStack_f28 = 0x42b0c0a542b0c0a5;
      auVar18._8_8_ = 0x42b0c0a542b0c0a5;
      auVar18._0_8_ = 0x42b0c0a542b0c0a5;
      auVar1 = vminps_avx(auVar1,auVar18);
      local_f70._0_8_ = auVar1._0_8_;
      local_f40 = local_f70._0_8_;
      local_f70._8_8_ = auVar1._8_8_;
      uStack_f38 = local_f70._8_8_;
      local_f50 = 0xc2b0c0a5c2b0c0a5;
      uStack_f48 = 0xc2b0c0a5c2b0c0a5;
      auVar2._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar4 = vmaxps_avx(auVar1,auVar2);
      local_f70._0_8_ = auVar4._0_8_;
      uVar9 = local_f70._0_8_;
      local_f70._8_8_ = auVar4._8_8_;
      uVar10 = local_f70._8_8_;
      local_e90 = 0x3fb8aa3b3fb8aa3b;
      uStack_e88 = 0x3fb8aa3b3fb8aa3b;
      local_e80._0_4_ = auVar4._0_4_;
      local_e80._4_4_ = auVar4._4_4_;
      uStack_e78._0_4_ = auVar4._8_4_;
      uStack_e78._4_4_ = auVar4._12_4_;
      local_f90._4_4_ = local_e80._4_4_ * 1.442695;
      local_f90._0_4_ = (float)local_e80 * 1.442695;
      uStack_f88._0_4_ = (float)uStack_e78 * 1.442695;
      uStack_f88._4_4_ = uStack_e78._4_4_ * 1.442695;
      local_e00 = local_f90;
      uStack_df8 = uStack_f88;
      local_e10 = 0x3f0000003f000000;
      uStack_e08 = 0x3f0000003f000000;
      local_f90._0_4_ = (float)local_e80 * 1.442695 + 0.5;
      local_f90._4_4_ = local_e80._4_4_ * 1.442695 + 0.5;
      fVar33 = (float)uStack_e78 * 1.442695 + 0.5;
      fVar35 = uStack_e78._4_4_ * 1.442695 + 0.5;
      uStack_f88._0_4_ = fVar33;
      uStack_f88._4_4_ = fVar35;
      local_3a0 = local_f90;
      uStack_398 = uStack_f88;
      local_fa0._4_4_ = (int)(float)local_f90._4_4_;
      local_fa0._0_4_ = (int)(float)local_f90._0_4_;
      local_fa0._8_4_ = (int)fVar33;
      local_fa0._12_4_ = (int)fVar35;
      local_390 = local_fa0._0_8_;
      uStack_388 = local_fa0._8_8_;
      auVar27._8_8_ = local_fa0._8_8_;
      auVar27._0_8_ = local_fa0._0_8_;
      auVar2 = vcvtdq2ps_avx(auVar27);
      local_f80 = auVar2._0_8_;
      local_370 = local_f80;
      uStack_f78 = auVar2._8_8_;
      uStack_368 = uStack_f78;
      local_380 = local_f90;
      uStack_378 = uStack_f88;
      auVar28._8_8_ = uStack_f88;
      auVar28._0_8_ = local_f90;
      auVar1 = vcmpps_avx(auVar28,auVar2,1);
      local_fc0._0_8_ = auVar1._0_8_;
      local_350 = local_fc0._0_8_;
      local_fc0._8_8_ = auVar1._8_8_;
      uStack_348 = local_fc0._8_8_;
      local_360 = 0x3f8000003f800000;
      uStack_358 = 0x3f8000003f800000;
      auVar29._8_8_ = 0x3f8000003f800000;
      auVar29._0_8_ = 0x3f8000003f800000;
      local_fc0 = vpand_avx(auVar1,auVar29);
      local_f00 = local_f80;
      uStack_ef8 = uStack_f78;
      local_f10 = local_fc0._0_8_;
      uStack_f08 = local_fc0._8_8_;
      _local_f90 = vsubps_avx(auVar2,local_fc0);
      local_328 = local_f90;
      local_2d0 = ::_ps_cephes_exp_C1;
      local_338 = local_f70;
      local_2b0 = local_f70._0_8_;
      uStack_2a8 = local_f70._8_8_;
      local_2a0[0] = 0.6933594;
      local_2a0[1] = 0.6933594;
      afStack_298[0] = 0.6933594;
      afStack_298[1] = 0.6933594;
      local_290._0_4_ = local_f90._0_4_;
      local_290._4_4_ = local_f90._4_4_;
      uStack_288._0_4_ = local_f90._8_4_;
      uStack_288._4_4_ = local_f90._12_4_;
      local_2c0 = (float)local_290 * 0.6933594;
      fStack_2bc = local_290._4_4_ * 0.6933594;
      fStack_2b8 = (float)uStack_288 * 0.6933594;
      fStack_2b4 = uStack_288._4_4_ * 0.6933594;
      auVar31._4_4_ = fStack_2bc;
      auVar31._0_4_ = local_2c0;
      auVar31._8_4_ = fStack_2b8;
      auVar31._12_4_ = fStack_2b4;
      auVar1 = vsubps_avx(auVar4,auVar31);
      local_330 = ::_ps_cephes_exp_C2;
      local_f70._0_8_ = auVar1._0_8_;
      local_310 = local_f70._0_8_;
      local_f70._8_8_ = auVar1._8_8_;
      uStack_308 = local_f70._8_8_;
      local_2f0 = local_f90;
      uStack_2e8 = uStack_f88;
      local_300[0] = -0.00021219444;
      local_300[1] = -0.00021219444;
      afStack_2f8[0] = -0.00021219444;
      afStack_2f8[1] = -0.00021219444;
      local_320 = (float)local_290 * -0.00021219444;
      fStack_31c = local_290._4_4_ * -0.00021219444;
      fStack_318 = (float)uStack_288 * -0.00021219444;
      fStack_314 = uStack_288._4_4_ * -0.00021219444;
      auVar30._4_4_ = fStack_31c;
      auVar30._0_4_ = local_320;
      auVar30._8_4_ = fStack_318;
      auVar30._12_4_ = fStack_314;
      local_f70 = vsubps_avx(auVar1,auVar30);
      local_eb0 = local_f70._0_8_;
      uStack_ea8 = local_f70._8_8_;
      local_ea0._0_4_ = local_f70._0_4_;
      local_ea0._4_4_ = local_f70._4_4_;
      uStack_e98._0_4_ = local_f70._8_4_;
      uStack_e98._4_4_ = local_f70._12_4_;
      local_f80 = CONCAT44(local_ea0._4_4_ * local_ea0._4_4_,(float)local_ea0 * (float)local_ea0);
      uStack_f78._0_4_ = (float)uStack_e98 * (float)uStack_e98;
      uStack_f78._4_4_ = uStack_e98._4_4_ * uStack_e98._4_4_;
      local_268 = &local_fd0;
      local_98 = ::_ps_cephes_exp_p1;
      local_70 = 0x3950696739506967;
      uStack_68 = 0x3950696739506967;
      local_80 = local_f70._0_8_;
      uStack_78 = local_f70._8_8_;
      local_50 = (float)local_ea0 * 0.00019875691;
      fStack_4c = local_ea0._4_4_ * 0.00019875691;
      fStack_48 = (float)uStack_e98 * 0.00019875691;
      fStack_44 = uStack_e98._4_4_ * 0.00019875691;
      local_60[0] = 0.0013981999;
      local_60[1] = 0.0013981999;
      afStack_58[0] = 0.0013981999;
      afStack_58[1] = 0.0013981999;
      local_fd0 = CONCAT44(fStack_4c + 0.0013981999,local_50 + 0.0013981999);
      uStack_fc8 = CONCAT44(fStack_44 + 0.0013981999,fStack_48 + 0.0013981999);
      local_f8 = ::_ps_cephes_exp_p2;
      local_d0 = local_fd0;
      uStack_c8 = uStack_fc8;
      local_e0 = local_f70._0_8_;
      uStack_d8 = local_f70._8_8_;
      local_b0 = (local_50 + 0.0013981999) * (float)local_ea0;
      fStack_ac = (fStack_4c + 0.0013981999) * local_ea0._4_4_;
      fStack_a8 = (fStack_48 + 0.0013981999) * (float)uStack_e98;
      fStack_a4 = (fStack_44 + 0.0013981999) * uStack_e98._4_4_;
      local_c0[0] = 0.008333452;
      local_c0[1] = 0.008333452;
      afStack_b8[0] = 0.008333452;
      afStack_b8[1] = 0.008333452;
      local_fd0 = CONCAT44(fStack_ac + 0.008333452,local_b0 + 0.008333452);
      uStack_fc8 = CONCAT44(fStack_a4 + 0.008333452,fStack_a8 + 0.008333452);
      local_158 = ::_ps_cephes_exp_p3;
      local_130 = local_fd0;
      uStack_128 = uStack_fc8;
      local_140 = local_f70._0_8_;
      uStack_138 = local_f70._8_8_;
      local_110 = (local_b0 + 0.008333452) * (float)local_ea0;
      fStack_10c = (fStack_ac + 0.008333452) * local_ea0._4_4_;
      fStack_108 = (fStack_a8 + 0.008333452) * (float)uStack_e98;
      fStack_104 = (fStack_a4 + 0.008333452) * uStack_e98._4_4_;
      local_120[0] = 0.041665796;
      local_120[1] = 0.041665796;
      afStack_118[0] = 0.041665796;
      afStack_118[1] = 0.041665796;
      local_fd0 = CONCAT44(fStack_10c + 0.041665796,local_110 + 0.041665796);
      uStack_fc8 = CONCAT44(fStack_104 + 0.041665796,fStack_108 + 0.041665796);
      local_1b8 = ::_ps_cephes_exp_p4;
      local_190 = local_fd0;
      uStack_188 = uStack_fc8;
      local_1a0 = local_f70._0_8_;
      uStack_198 = local_f70._8_8_;
      local_170 = (local_110 + 0.041665796) * (float)local_ea0;
      fStack_16c = (fStack_10c + 0.041665796) * local_ea0._4_4_;
      fStack_168 = (fStack_108 + 0.041665796) * (float)uStack_e98;
      fStack_164 = (fStack_104 + 0.041665796) * uStack_e98._4_4_;
      local_180[0] = 0.16666666;
      local_180[1] = 0.16666666;
      afStack_178[0] = 0.16666666;
      afStack_178[1] = 0.16666666;
      local_fd0 = CONCAT44(fStack_16c + 0.16666666,local_170 + 0.16666666);
      uStack_fc8 = CONCAT44(fStack_164 + 0.16666666,fStack_168 + 0.16666666);
      local_218 = ::_ps_cephes_exp_p5;
      local_1f0 = local_fd0;
      uStack_1e8 = uStack_fc8;
      local_200 = local_f70._0_8_;
      uStack_1f8 = local_f70._8_8_;
      local_1d0 = (local_170 + 0.16666666) * (float)local_ea0;
      fStack_1cc = (fStack_16c + 0.16666666) * local_ea0._4_4_;
      fStack_1c8 = (fStack_168 + 0.16666666) * (float)uStack_e98;
      fStack_1c4 = (fStack_164 + 0.16666666) * uStack_e98._4_4_;
      local_1e0[0] = 0.5;
      local_1e0[1] = 0.5;
      afStack_1d8[0] = 0.5;
      afStack_1d8[1] = 0.5;
      local_fd0 = CONCAT44(fStack_1cc + 0.5,local_1d0 + 0.5);
      uStack_fc8 = CONCAT44(fStack_1c4 + 0.5,fStack_1c8 + 0.5);
      local_270 = &local_f80;
      local_250 = local_fd0;
      uStack_248 = uStack_fc8;
      local_260 = local_f80;
      uStack_258 = uStack_f78;
      local_230 = (local_1d0 + 0.5) * (float)local_ea0 * (float)local_ea0;
      fStack_22c = (fStack_1cc + 0.5) * local_ea0._4_4_ * local_ea0._4_4_;
      fStack_228 = (fStack_1c8 + 0.5) * (float)uStack_e98 * (float)uStack_e98;
      fStack_224 = (fStack_1c4 + 0.5) * uStack_e98._4_4_ * uStack_e98._4_4_;
      local_240 = local_f70._0_8_;
      uStack_238 = local_f70._8_8_;
      local_fd0 = CONCAT44(fStack_22c + local_ea0._4_4_,local_230 + (float)local_ea0);
      uStack_fc8 = CONCAT44(fStack_224 + uStack_e98._4_4_,fStack_228 + (float)uStack_e98);
      local_e20 = local_fd0;
      uStack_e18 = uStack_fc8;
      local_e30 = 0x3f8000003f800000;
      uStack_e28 = 0x3f8000003f800000;
      fVar33 = local_230 + (float)local_ea0 + 1.0;
      fVar35 = fStack_22c + local_ea0._4_4_ + 1.0;
      fVar36 = fStack_228 + (float)uStack_e98 + 1.0;
      fVar37 = fStack_224 + uStack_e98._4_4_ + 1.0;
      local_fd0 = CONCAT44(fVar35,fVar33);
      uStack_fc8 = CONCAT44(fVar37,fVar36);
      local_3b0 = local_f90;
      uStack_3a8 = uStack_f88;
      local_fa0._4_4_ = (int)local_290._4_4_;
      local_fa0._0_4_ = (int)(float)local_290;
      local_fa0._8_4_ = (int)(float)uStack_288;
      local_fa0._12_4_ = (int)uStack_288._4_4_;
      local_420 = local_fa0._0_8_;
      uStack_418 = local_fa0._8_8_;
      local_430 = 0x7f0000007f;
      uStack_428 = 0x7f0000007f;
      auVar26._8_8_ = local_fa0._8_8_;
      auVar26._0_8_ = local_fa0._0_8_;
      auVar25._8_8_ = 0x7f0000007f;
      auVar25._0_8_ = 0x7f0000007f;
      auVar1 = vpaddd_avx(auVar26,auVar25);
      local_fa0._0_8_ = auVar1._0_8_;
      local_3c0 = local_fa0._0_8_;
      local_fa0._8_8_ = auVar1._8_8_;
      uStack_3b8 = local_fa0._8_8_;
      local_3c4 = 0x17;
      local_fa0 = vpslld_avx(auVar1,ZEXT416(0x17));
      local_40 = local_fa0._0_8_;
      uStack_38 = local_fa0._8_8_;
      local_fe0 = local_fa0._0_8_;
      uStack_fd8 = local_fa0._8_8_;
      local_ec0 = local_fd0;
      uStack_eb8 = uStack_fc8;
      local_ed0._0_4_ = local_fa0._0_4_;
      local_ed0._4_4_ = local_fa0._4_4_;
      uStack_ec8._0_4_ = local_fa0._8_4_;
      uStack_ec8._4_4_ = local_fa0._12_4_;
      local_fd0 = CONCAT44(fVar35 * local_ed0._4_4_,fVar33 * (float)local_ed0);
      uStack_fc8 = CONCAT44(fVar37 * uStack_ec8._4_4_,fVar36 * (float)uStack_ec8);
      local_ee0 = local_fd0;
      uStack_ed8 = uStack_fc8;
      auVar19._8_8_ = uStack_fc8;
      auVar19._0_8_ = local_fd0;
      auVar1._8_8_ = 0x3f8000003f800000;
      auVar1._0_8_ = 0x3f8000003f800000;
      auVar1 = vsubps_avx(auVar19,auVar1);
      local_1780 = auVar1._0_8_;
      uVar11 = local_1780;
      uStack_1778 = auVar1._8_8_;
      uVar12 = uStack_1778;
      local_e50._0_4_ = auVar1._0_4_;
      local_e50._4_4_ = auVar1._4_4_;
      uStack_e48._0_4_ = auVar1._8_4_;
      uStack_e48._4_4_ = auVar1._12_4_;
      local_1780 = CONCAT44(local_1060 * local_e50._4_4_,local_1060 * (float)local_e50);
      uStack_1778._0_4_ = local_1060 * (float)uStack_e48;
      uStack_1778._4_4_ = local_1060 * uStack_e48._4_4_;
      local_1760 = auVar3._0_8_;
      uStack_1758 = auVar3._8_8_;
      local_df0 = local_1780;
      uStack_de8 = uStack_1778;
      local_de0._0_4_ = auVar3._0_4_;
      local_de0._4_4_ = auVar3._4_4_;
      uStack_dd8._0_4_ = auVar3._8_4_;
      uStack_dd8._4_4_ = auVar3._12_4_;
      local_e70 = (float)local_de0 + local_1060 * (float)local_e50;
      fStack_e6c = local_de0._4_4_ + local_1060 * local_e50._4_4_;
      fStack_e68 = (float)uStack_dd8 + local_1060 * (float)uStack_e48;
      fStack_e64 = uStack_dd8._4_4_ + local_1060 * uStack_e48._4_4_;
      local_1780 = CONCAT44(local_1080 * fStack_e6c,local_1080 * local_e70);
      uStack_1778._0_4_ = local_1080 * fStack_e68;
      uStack_1778._4_4_ = local_1080 * fStack_e64;
      local_db8 = local_1598;
      local_dd0 = local_1780;
      uStack_dc8 = uStack_1778;
      *(undefined8 *)*local_1598 = local_1780;
      *(undefined8 *)(*local_1598 + 8) = uStack_1778;
      local_1598 = (undefined1 (*) [32])(*local_1598 + 0x10);
      local_1000 = local_1020;
      uStack_ff8 = uStack_1018;
      local_ef0 = 0x3f8000003f800000;
      uStack_ee8 = 0x3f8000003f800000;
      local_ed0 = local_fa0._0_8_;
      uStack_ec8 = local_fa0._8_8_;
      local_ea0 = local_eb0;
      uStack_e98 = uStack_ea8;
      local_e80 = uVar9;
      uStack_e78 = uVar10;
      local_e60 = CONCAT44(local_1080,local_1080);
      uStack_e58 = CONCAT44(local_1080,local_1080);
      local_e50 = uVar11;
      uStack_e48 = uVar12;
      local_e40 = CONCAT44(local_1060,local_1060);
      uStack_e38 = CONCAT44(local_1060,local_1060);
      local_de0 = local_1760;
      uStack_dd8 = uStack_1758;
      local_2d8 = local_338;
      local_2c8 = local_328;
      local_290 = local_f90;
      uStack_288 = uStack_f88;
      local_278 = local_338;
      local_210 = local_338;
      local_208 = local_268;
      local_1b0 = local_338;
      local_1a8 = local_268;
      local_150 = local_338;
      local_148 = local_268;
      local_f0 = local_338;
      local_e8 = local_268;
      local_90 = local_338;
      local_88 = local_268;
    }
    fVar33 = *(float *)(in_RDI + 0xd0);
    fVar35 = *(float *)(in_RDI + 0xd4);
    fStack_107c = local_1080;
    fStack_1078 = local_1080;
    fStack_1074 = local_1080;
    local_1064 = local_1080;
    fStack_105c = local_1060;
    fStack_1058 = local_1060;
    fStack_1054 = local_1060;
    local_1044 = local_1060;
    local_d50 = local_1530;
    local_cc0 = local_14f0;
    local_cbc = local_14f0;
    local_cb8 = local_14f0;
    local_cb4 = local_14f0;
    local_cb0 = local_14f0;
    local_cac = local_14f0;
    local_ca8 = local_14f0;
    local_ca4 = local_14f0;
    local_ca0 = auVar34;
    local_c78 = local_14f4;
    local_c74 = local_14f4;
    local_c70 = local_14f4;
    local_c6c = local_14f4;
    local_c68 = local_14f4;
    local_c64 = local_14f4;
    local_c60 = local_14f4;
    local_c5c = local_14f4;
    local_15c0 = local_db0;
    for (; local_15f0 < local_1588; local_15f0 = local_15f0 + 1) {
      if (0.0 <= *(float *)*local_1598) {
        *(float *)*local_1598 = *(float *)*local_1598 * *(float *)(in_RDI + 0xd4);
      }
      else {
        fVar36 = expf(*(float *)*local_1598);
        *(float *)*local_1598 = (fVar36 - 1.0) * fVar33 * fVar35;
      }
      local_1598 = (undefined1 (*) [32])(*local_1598 + 4);
    }
  }
  return 0;
}

Assistant:

int SELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}